

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shell.cpp
# Opt level: O0

void __thiscall
duckdb_shell::ShellState::ExecutePreparedStatement(ShellState *this,sqlite3_stmt *pStmt)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  reference pvVar5;
  uchar *puVar6;
  reference ppcVar7;
  pointer pRVar8;
  long in_RDI;
  int i_1;
  unique_ptr<duckdb_shell::RowRenderer,_std::default_delete<duckdb_shell::RowRenderer>_> renderer;
  int i;
  int nCol;
  RowResult result;
  int rc;
  TrashRenderer renderer_2;
  DuckBoxRenderer renderer_1;
  LargeNumberRendering large_rendering;
  size_t max_width;
  size_t max_rows;
  char in_stack_00000493;
  int in_stack_00000494;
  char *in_stack_00000498;
  size_t in_stack_000004a0;
  size_t in_stack_000004a8;
  sqlite3_stmt *in_stack_000004b0;
  char in_stack_000004c0;
  int in_stack_000004c8;
  BaseResultRenderer *in_stack_000004d0;
  undefined4 in_stack_fffffffffffffe78;
  undefined4 in_stack_fffffffffffffe7c;
  undefined4 in_stack_fffffffffffffe80;
  undefined4 in_stack_fffffffffffffe84;
  ShellState *in_stack_fffffffffffffe88;
  undefined7 in_stack_fffffffffffffe90;
  undefined1 in_stack_fffffffffffffe97;
  undefined4 in_stack_fffffffffffffe98;
  undefined4 in_stack_fffffffffffffe9c;
  DuckBoxRenderer *in_stack_fffffffffffffea0;
  size_type in_stack_fffffffffffffea8;
  undefined4 in_stack_fffffffffffffeb0;
  undefined4 in_stack_fffffffffffffeb4;
  char *in_stack_fffffffffffffec0;
  undefined4 in_stack_fffffffffffffec8;
  int iVar9;
  int local_104;
  int local_f0;
  undefined1 local_e8 [24];
  vector<const_char_*,_std::allocator<const_char_*>_> local_d0;
  vector<int,_std::allocator<int>_> local_b8;
  int local_94;
  int in_stack_ffffffffffffffa4;
  sqlite3_stmt *in_stack_ffffffffffffffa8;
  sqlite3_stmt *in_stack_ffffffffffffffb8;
  ShellState *in_stack_ffffffffffffffc0;
  
  if (*(int *)(in_RDI + 0x34) == 0x14) {
    uVar4 = std::__cxx11::string::empty();
    if ((uVar4 & 1) == 0) {
      std::__cxx11::string::operator[](in_RDI + 0x120);
    }
    HighlightResults();
    DuckBoxRenderer::DuckBoxRenderer
              (in_stack_fffffffffffffea0,
               (ShellState *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
               (bool)in_stack_fffffffffffffe97);
    std::__cxx11::string::c_str();
    duckdb_shell_sqlite3_print_duckbox
              (in_stack_000004b0,in_stack_000004a8,in_stack_000004a0,in_stack_00000498,
               in_stack_00000494,in_stack_00000493,in_stack_000004c0,in_stack_000004c8,
               in_stack_000004d0);
    DuckBoxRenderer::~DuckBoxRenderer((DuckBoxRenderer *)0x1db51f);
  }
  else if (*(int *)(in_RDI + 0x34) == 0x12) {
    TrashRenderer::TrashRenderer
              ((TrashRenderer *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80));
    duckdb_shell_sqlite3_print_duckbox
              (in_stack_000004b0,in_stack_000004a8,in_stack_000004a0,in_stack_00000498,
               in_stack_00000494,in_stack_00000493,in_stack_000004c0,in_stack_000004c8,
               in_stack_000004d0);
    TrashRenderer::~TrashRenderer((TrashRenderer *)0x1db5b7);
  }
  else {
    bVar1 = ShellRenderer::IsColumnar(*(RenderMode *)(in_RDI + 0x34));
    if (bVar1) {
      ExecutePreparedStatementColumnar(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    }
    else {
      local_94 = duckdb_shell_sqlite3_step
                           ((sqlite3_stmt *)
                            renderer_1.super_BaseResultRenderer.value_type.type_info_.internal.
                            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr);
      if (local_94 == 100) {
        RowResult::RowResult
                  ((RowResult *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80));
        iVar2 = duckdb_shell_sqlite3_column_count
                          ((sqlite3_stmt *)
                           CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
        iVar9 = iVar2;
        std::vector<const_char_*,_std::allocator<const_char_*>_>::reserve
                  ((vector<const_char_*,_std::allocator<const_char_*>_> *)
                   CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                   in_stack_fffffffffffffea8);
        std::vector<const_char_*,_std::allocator<const_char_*>_>::resize
                  ((vector<const_char_*,_std::allocator<const_char_*>_> *)in_stack_fffffffffffffea0,
                   CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
        std::vector<int,_std::allocator<int>_>::resize
                  ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffea0,
                   CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
        for (local_f0 = 0; local_f0 < iVar2; local_f0 = local_f0 + 1) {
          in_stack_fffffffffffffec0 =
               duckdb_shell_sqlite3_column_name
                         ((sqlite3_stmt *)
                          CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),0);
          std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
                    ((vector<const_char_*,_std::allocator<const_char_*>_> *)
                     CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                     (value_type *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
        }
        GetRowRenderer((ShellState *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
        do {
          for (local_104 = 0; local_104 < iVar2; local_104 = local_104 + 1) {
            iVar3 = duckdb_shell_sqlite3_column_type
                              ((sqlite3_stmt *)CONCAT44(iVar9,in_stack_fffffffffffffec8),
                               (int)((ulong)in_stack_fffffffffffffec0 >> 0x20));
            pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&local_b8,(long)local_104);
            *pvVar5 = iVar3;
            puVar6 = duckdb_shell_sqlite3_column_text
                               (in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4);
            ppcVar7 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[]
                                (&local_d0,(long)local_104);
            *ppcVar7 = (value_type)puVar6;
            ppcVar7 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[]
                                (&local_d0,(long)local_104);
            if ((*ppcVar7 == (value_type)0x0) &&
               (pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                                   (&local_b8,(long)local_104), *pvVar5 != 5)) {
              local_94 = 7;
              break;
            }
          }
          if (local_94 == 100) {
            std::
            unique_ptr<duckdb_shell::RowRenderer,_std::default_delete<duckdb_shell::RowRenderer>_>::
            operator*((unique_ptr<duckdb_shell::RowRenderer,_std::default_delete<duckdb_shell::RowRenderer>_>
                       *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80));
            iVar3 = RenderRow(in_stack_fffffffffffffe88,
                              (RowRenderer *)
                              CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                              (RowResult *)
                              CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
            if (iVar3 == 0) {
              local_94 = duckdb_shell_sqlite3_step
                                   ((sqlite3_stmt *)
                                    renderer_1.super_BaseResultRenderer.value_type.type_info_.
                                    internal.
                                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr);
            }
            else {
              local_94 = 4;
            }
          }
        } while (local_94 == 100);
        pRVar8 = std::
                 unique_ptr<duckdb_shell::RowRenderer,_std::default_delete<duckdb_shell::RowRenderer>_>
                 ::operator->((unique_ptr<duckdb_shell::RowRenderer,_std::default_delete<duckdb_shell::RowRenderer>_>
                               *)0x1db909);
        (*(pRVar8->super_ShellRenderer)._vptr_ShellRenderer[5])(pRVar8,local_e8);
        std::unique_ptr<duckdb_shell::RowRenderer,_std::default_delete<duckdb_shell::RowRenderer>_>
        ::~unique_ptr((unique_ptr<duckdb_shell::RowRenderer,_std::default_delete<duckdb_shell::RowRenderer>_>
                       *)CONCAT17(in_stack_fffffffffffffe97,in_stack_fffffffffffffe90));
        RowResult::~RowResult
                  ((RowResult *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80));
      }
    }
  }
  return;
}

Assistant:

void ShellState::ExecutePreparedStatement(sqlite3_stmt *pStmt) {
	if (cMode == RenderMode::DUCKBOX) {
		size_t max_rows = this->max_rows;
		size_t max_width = this->max_width;
		if (!outfile.empty() && outfile[0] != '|') {
			max_rows = (size_t)-1;
			max_width = (size_t)-1;
		}
		LargeNumberRendering large_rendering = large_number_rendering;
		if (!stdout_is_console) {
			max_width = (size_t)-1;
		}
		if (large_rendering == LargeNumberRendering::DEFAULT) {
			large_rendering = stdout_is_console ? LargeNumberRendering::FOOTER : LargeNumberRendering::NONE;
		}

		DuckBoxRenderer renderer(*this, HighlightResults());
		sqlite3_print_duckbox(pStmt, max_rows, max_width, nullValue.c_str(), columns, thousand_separator,
		                      decimal_separator, int(large_rendering), &renderer);
		return;
	}
	if (cMode == RenderMode::TRASH) {
		TrashRenderer renderer;
		sqlite3_print_duckbox(pStmt, 1, 80, "", false, '\0', '\0', 0, &renderer);
		return;
	}

	if (ShellRenderer::IsColumnar(cMode)) {
		ExecutePreparedStatementColumnar(pStmt);
		return;
	}

	/* perform the first step.  this will tell us if we
	** have a result set or not and how wide it is.
	*/
	int rc = sqlite3_step(pStmt);
	/* if we have a result set... */
	if (SQLITE_ROW != rc) {
		return;
	}
	RowResult result;
	// initialize the result and the column names
	int nCol = sqlite3_column_count(pStmt);
	result.column_names.reserve(nCol);
	result.data.resize(nCol);
	result.types.resize(nCol);
	for (int i = 0; i < nCol; i++) {
		result.column_names.push_back(sqlite3_column_name(pStmt, i));
	}
	result.pStmt = pStmt;

	auto renderer = GetRowRenderer();

	// iterate over the rows
	do {
		/* extract the data and data types */
		for (int i = 0; i < nCol; i++) {
			result.types[i] = sqlite3_column_type(pStmt, i);
			result.data[i] = (const char *)sqlite3_column_text(pStmt, i);
			if (!result.data[i] && result.types[i] != SQLITE_NULL) {
				// OOM
				rc = SQLITE_NOMEM;
				break;
			}
		}

		/* if data and types extracted successfully... */
		if (SQLITE_ROW == rc) {
			/* call the supplied callback with the result row data */
			if (RenderRow(*renderer, result)) {
				rc = SQLITE_ABORT;
			} else {
				rc = sqlite3_step(pStmt);
			}
		}
	} while (SQLITE_ROW == rc);

	renderer->RenderFooter(result);
}